

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

SQInteger __thiscall
SQVM::FallBackGet(SQVM *this,SQObjectPtr *self,SQObjectPtr *key,SQObjectPtr *dest)

{
  SQObjectType SVar1;
  SQTable *pSVar2;
  bool bVar3;
  int iVar4;
  SQObjectPtr closure;
  
  SVar1 = (self->super_SQObject)._type;
  if (SVar1 != OT_TABLE) {
    if (SVar1 == OT_INSTANCE) goto LAB_0012a8cf;
    if (SVar1 != OT_USERDATA) {
      return 1;
    }
  }
  pSVar2 = ((self->super_SQObject)._unVal.pDelegable)->_delegate;
  if (pSVar2 == (SQTable *)0x0) {
    return 1;
  }
  SQObjectPtr::SQObjectPtr(&closure,pSVar2);
  bVar3 = Get(this,&closure,key,dest,0,0x29a);
  SQObjectPtr::~SQObjectPtr(&closure);
  if (bVar3) {
    return 0;
  }
LAB_0012a8cf:
  closure.super_SQObject._type = OT_NULL;
  closure.super_SQObject._unVal.pTable = (SQTable *)0x0;
  pSVar2 = (self->super_SQObject)._unVal.pTable;
  iVar4 = (*(pSVar2->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[6]
          )(pSVar2,this,7);
  if ((char)iVar4 == '\0') {
    bVar3 = true;
  }
  else {
    Push(this,self);
    Push(this,key);
    this->_nmetamethodscall = this->_nmetamethodscall + 1;
    bVar3 = Call(this,&closure,2,this->_top + -2,dest,0);
    if (bVar3) {
      Pop(this,2);
      dest = (SQObjectPtr *)0x0;
      bVar3 = false;
    }
    else {
      dest = (SQObjectPtr *)0x2;
      Pop(this,2);
      bVar3 = (this->_lasterror).super_SQObject._type == OT_NULL;
    }
    this->_nmetamethodscall = this->_nmetamethodscall + -1;
  }
  SQObjectPtr::~SQObjectPtr(&closure);
  if (bVar3) {
    return 1;
  }
  return (SQInteger)dest;
}

Assistant:

SQInteger SQVM::FallBackGet(const SQObjectPtr &self,const SQObjectPtr &key,SQObjectPtr &dest)
{
    switch(type(self)){
    case OT_TABLE:
    case OT_USERDATA:
        //delegation
        if(_delegable(self)->_delegate) {
            if(Get(SQObjectPtr(_delegable(self)->_delegate),key,dest,0,DONT_FALL_BACK)) return FALLBACK_OK;
        }
        else {
            return FALLBACK_NO_MATCH;
        }
        //go through
    case OT_INSTANCE: {
        SQObjectPtr closure;
        if(_delegable(self)->GetMetaMethod(this, MT_GET, closure)) {
            Push(self);Push(key);
            _nmetamethodscall++;
            AutoDec ad(&_nmetamethodscall);
            if(Call(closure, 2, _top - 2, dest, SQFalse)) {
                Pop(2);
                return FALLBACK_OK;
            }
            else {
                Pop(2);
                if(type(_lasterror) != OT_NULL) { //NULL means "clean failure" (not found)
                    return FALLBACK_ERROR;
                }
            }
        }
                      }
        break;
    default: break;//shutup GCC 4.x
    }
    // no metamethod or no fallback type
    return FALLBACK_NO_MATCH;
}